

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

real __thiscall sdf_tools::sdf::SdfBox::at(SdfBox *this,real3 r)

{
  real3 *prVar1;
  int iVar2;
  float *pfVar3;
  real3 *in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  float in_XMM1_Da;
  real3 d;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_10;
  float local_8;
  
  local_40 = *(undefined4 *)(in_RDI + 0x10);
  prVar1 = (real3 *)(in_RDI + 8);
  local_48._0_4_ = prVar1->x;
  local_48._4_4_ = prVar1->y;
  local_38 = local_48;
  local_30 = local_40;
  local_10 = in_XMM0_Qa;
  local_8 = in_XMM1_Da;
  operator-=((sdf_tools *)&local_10,in_RSI,*prVar1);
  local_58 = (float)local_10 - *(float *)(in_RDI + 0x14);
  local_5c = -(float)local_10 - *(float *)(in_RDI + 0x14);
  pfVar3 = std::max<float>(&local_58,&local_5c);
  local_54 = *pfVar3;
  local_60 = local_10._4_4_ - *(float *)(in_RDI + 0x18);
  local_64 = -local_10._4_4_ - *(float *)(in_RDI + 0x18);
  pfVar3 = std::max<float>(&local_60,&local_64);
  local_50 = *pfVar3;
  local_68 = local_8 - *(float *)(in_RDI + 0x1c);
  local_6c = -local_8 - *(float *)(in_RDI + 0x1c);
  pfVar3 = std::max<float>(&local_68,&local_6c);
  local_4c = *pfVar3;
  iVar2 = *(int *)(in_RDI + 0x20);
  pfVar3 = std::max<float>(&local_50,&local_4c);
  pfVar3 = std::max<float>(&local_54,pfVar3);
  return (float)iVar2 * *pfVar3;
}

Assistant:

real SdfBox::at(real3 r) const
{
    r -= center_;
    real3 d {std::max(r.x - halfExtents_.x, -r.x - halfExtents_.x),
             std::max(r.y - halfExtents_.y, -r.y - halfExtents_.y),
             std::max(r.z - halfExtents_.z, -r.z - halfExtents_.z)};

    return sign_ * std::max(d.x, std::max(d.y, d.z));
}